

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O0

int nifti_intent_code(char *name)

{
  int iVar1;
  size_t sVar2;
  char *__dest;
  int local_30;
  int local_2c;
  char *pcStack_28;
  int ii;
  char *upt;
  char *unam;
  char *name_local;
  
  if ((name == (char *)0x0) || (*name == '\0')) {
    name_local._4_4_ = -1;
  }
  else {
    sVar2 = strlen(name);
    __dest = (char *)malloc(sVar2 + 1);
    strcpy(__dest,name);
    for (pcStack_28 = __dest; *pcStack_28 != '\0'; pcStack_28 = pcStack_28 + 1) {
      iVar1 = toupper((int)*pcStack_28);
      *pcStack_28 = (char)iVar1;
    }
    local_2c = 2;
    while ((local_2c < 0x19 && (iVar1 = strcmp(inam[local_2c],__dest), iVar1 != 0))) {
      local_2c = local_2c + 1;
    }
    free(__dest);
    if (local_2c < 0x19) {
      local_30 = local_2c;
    }
    else {
      local_30 = -1;
    }
    name_local._4_4_ = local_30;
  }
  return name_local._4_4_;
}

Assistant:

int nifti_intent_code( char *name )
{
   char *unam , *upt ;
   int ii ;

   if( name == NULL || *name == '\0' ) return -1 ;

   unam = (char *)malloc(strlen(name)+1);
   strcpy(unam,name);
   for( upt=unam ; *upt != '\0' ; upt++ ) *upt = (char)toupper(*upt) ;

   for( ii=NIFTI_FIRST_STATCODE ; ii <= NIFTI_LAST_STATCODE ; ii++ )
     if( strcmp(inam[ii],unam) == 0 ) break ;

   free(unam) ;
   return (ii <= NIFTI_LAST_STATCODE) ? ii : -1 ;
}